

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

RenderContext *
glu::createRenderContext(Platform *platform,CommandLine *cmdLine,RenderConfig *config)

{
  ContextFactory *__s;
  bool bVar1;
  int iVar2;
  SurfaceType SVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  NotSupportedError *pNVar6;
  FboRenderContext *this;
  undefined4 extraout_var_01;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  FactoryBase *local_80;
  ContextFactory *curFactory;
  int factoryNdx;
  ContextFactory *local_40;
  ContextFactory *factory;
  char *factoryName;
  ContextFactoryRegistry *registry;
  RenderConfig *config_local;
  CommandLine *cmdLine_local;
  Platform *platform_local;
  
  registry = (ContextFactoryRegistry *)config;
  config_local = (RenderConfig *)cmdLine;
  cmdLine_local = (CommandLine *)platform;
  iVar2 = (*platform->_vptr_Platform[3])();
  factoryName = (char *)Platform::getContextFactoryRegistry
                                  ((Platform *)CONCAT44(extraout_var,iVar2));
  factory = (ContextFactory *)tcu::CommandLine::getGLContextType((CommandLine *)config_local);
  local_40 = (ContextFactory *)0x0;
  bVar1 = tcu::FactoryRegistry<glu::ContextFactory>::empty
                    ((FactoryRegistry<glu::ContextFactory> *)factoryName);
  pcVar5 = factoryName;
  __s = factory;
  if (bVar1) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"OpenGL is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0x8d);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (factory == (ContextFactory *)0x0) {
    local_40 = tcu::FactoryRegistry<glu::ContextFactory>::getDefaultFactory
                         ((FactoryRegistry<glu::ContextFactory> *)factoryName);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&factoryNdx,(char *)__s,(allocator<char> *)((long)&curFactory + 7));
    local_40 = tcu::FactoryRegistry<glu::ContextFactory>::getFactoryByName
                         ((FactoryRegistry<glu::ContextFactory> *)pcVar5,(string *)&factoryNdx);
    std::__cxx11::string::~string((string *)&factoryNdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&curFactory + 7));
    if (local_40 == (ContextFactory *)0x0) {
      tcu::print("ERROR: Unknown or unsupported GL context type \'%s\'\n",factory);
      tcu::print("Supported GL context types:\n");
      for (curFactory._0_4_ = 0; iVar2 = (int)curFactory,
          sVar4 = tcu::FactoryRegistry<glu::ContextFactory>::getFactoryCount
                            ((FactoryRegistry<glu::ContextFactory> *)factoryName),
          iVar2 < (int)sVar4; curFactory._0_4_ = (int)curFactory + 1) {
        local_80 = &tcu::FactoryRegistry<glu::ContextFactory>::getFactoryByIndex
                              ((FactoryRegistry<glu::ContextFactory> *)factoryName,
                               (long)(int)curFactory)->super_FactoryBase;
        iVar2 = (*(((FactoryBase *)&local_80->super_AbstractFactory)->super_AbstractFactory).
                  _vptr_AbstractFactory[2])();
        pcVar5 = tcu::FactoryBase::getDescription(local_80);
        tcu::print("  %s: %s\n",CONCAT44(extraout_var_00,iVar2),pcVar5);
      }
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Unknown GL context type \'",&local_e1);
      std::operator+(&local_c0,&local_e0,(char *)factory);
      std::operator+(&local_a0,&local_c0,"\'");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,pcVar5,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0x9e);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  SVar3 = tcu::CommandLine::getSurfaceType((CommandLine *)config_local);
  if (SVar3 == SURFACETYPE_FBO) {
    this = (FboRenderContext *)operator_new(0x40);
    FboRenderContext::FboRenderContext
              (this,local_40,(RenderConfig *)registry,(CommandLine *)config_local);
    platform_local = (Platform *)this;
  }
  else {
    iVar2 = (*(local_40->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                      (local_40,registry,config_local);
    platform_local = (Platform *)CONCAT44(extraout_var_01,iVar2);
  }
  return (RenderContext *)platform_local;
}

Assistant:

RenderContext* createRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, const RenderConfig& config)
{
	const ContextFactoryRegistry&	registry		= platform.getGLPlatform().getContextFactoryRegistry();
	const char*						factoryName		= cmdLine.getGLContextType();
	const ContextFactory*			factory			= DE_NULL;

	if (registry.empty())
		throw tcu::NotSupportedError("OpenGL is not supported", DE_NULL, __FILE__, __LINE__);

	if (factoryName)
	{
		factory = registry.getFactoryByName(factoryName);

		if (!factory)
		{
			tcu::print("ERROR: Unknown or unsupported GL context type '%s'\n", factoryName);
			tcu::print("Supported GL context types:\n");

			for (int factoryNdx = 0; factoryNdx < (int)registry.getFactoryCount(); factoryNdx++)
			{
				const ContextFactory* curFactory = registry.getFactoryByIndex(factoryNdx);
				tcu::print("  %s: %s\n", curFactory->getName(), curFactory->getDescription());
			}

			throw tcu::NotSupportedError((std::string("Unknown GL context type '") + factoryName + "'").c_str(), DE_NULL, __FILE__, __LINE__);
		}
	}
	else
		factory = registry.getDefaultFactory();

	if (cmdLine.getSurfaceType() == tcu::SURFACETYPE_FBO)
		return new FboRenderContext(*factory, config, cmdLine);
	else
		return factory->createContext(config, cmdLine);
}